

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialog::forceShow(QProgressDialog *this)

{
  QProgressDialogPrivate *pQVar1;
  QWidget *unaff_retaddr;
  QProgressDialogPrivate *d;
  
  pQVar1 = d_func((QProgressDialog *)0x7b255b);
  QTimer::stop();
  if (((pQVar1->shownOnce & 1U) == 0) && ((pQVar1->cancellationFlag & 1U) == 0)) {
    QWidget::show(unaff_retaddr);
    pQVar1->shownOnce = true;
  }
  return;
}

Assistant:

void QProgressDialog::forceShow()
{
    Q_D(QProgressDialog);
    d->forceTimer->stop();
    if (d->shownOnce || d->cancellationFlag)
        return;

    show();
    d->shownOnce = true;
}